

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

bool __thiscall
lunasvg::SVGLinearGradientElement::applyPaint
          (SVGLinearGradientElement *this,SVGRenderState *state,float opacity)

{
  float e;
  float f;
  float a;
  float d;
  bool bVar1;
  Units UVar2;
  SpreadMethod spread;
  SVGLength *pSVar3;
  SVGLength *length;
  size_type sVar4;
  reference pvVar5;
  Canvas *pCVar6;
  Transform *pTVar7;
  float x1_00;
  float y1_00;
  float x2_00;
  float y2_00;
  Rect RVar8;
  Transform local_10c;
  undefined8 local_f4;
  Rect bbox;
  Transform gradientTransform;
  Units gradientUnits;
  SpreadMethod spreadMethod;
  value_type *lastStop;
  float y2;
  float x2;
  float y1;
  float x1;
  undefined1 local_a0 [8];
  LengthContext lengthContext;
  undefined1 local_88 [8];
  GradientStops gradientStops;
  SVGGradientElement *gradientContentElement;
  SVGLinearGradientAttributes attributes;
  float opacity_local;
  SVGRenderState *state_local;
  SVGLinearGradientElement *this_local;
  
  attributes.m_y2._4_4_ = opacity;
  collectGradientAttributes((SVGLinearGradientAttributes *)&gradientContentElement,this);
  gradientStops.
  super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)SVGGradientAttributes::gradientContentElement
                          ((SVGGradientAttributes *)&gradientContentElement);
  buildGradientStops((GradientStops *)local_88,
                     (SVGGradientElement *)
                     gradientStops.
                     super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,attributes.m_y2._4_4_);
  bVar1 = std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::empty
                    ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_> *)
                     local_88);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    UVar2 = SVGGradientAttributes::gradientUnits((SVGGradientAttributes *)&gradientContentElement);
    LengthContext::LengthContext((LengthContext *)local_a0,(SVGElement *)this,UVar2);
    pSVar3 = SVGLinearGradientAttributes::x1((SVGLinearGradientAttributes *)&gradientContentElement)
    ;
    x1_00 = LengthContext::valueForLength((LengthContext *)local_a0,pSVar3);
    SVGLinearGradientAttributes::y1
              ((SVGLinearGradientAttributes *)&gradientContentElement,(double)(ulong)(uint)x1_00);
    y1_00 = LengthContext::valueForLength((LengthContext *)local_a0,length);
    pSVar3 = SVGLinearGradientAttributes::x2((SVGLinearGradientAttributes *)&gradientContentElement)
    ;
    x2_00 = LengthContext::valueForLength((LengthContext *)local_a0,pSVar3);
    pSVar3 = SVGLinearGradientAttributes::y2((SVGLinearGradientAttributes *)&gradientContentElement)
    ;
    y2_00 = LengthContext::valueForLength((LengthContext *)local_a0,pSVar3);
    sVar4 = std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::size
                      ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_> *)
                       local_88);
    if ((sVar4 == 1) ||
       ((((x1_00 == x2_00 && (!NAN(x1_00) && !NAN(x2_00))) && (y1_00 == y2_00)) &&
        (!NAN(y1_00) && !NAN(y2_00))))) {
      pvVar5 = std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::back
                         ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                           *)local_88);
      pCVar6 = SVGRenderState::operator->(state);
      Canvas::setColor(pCVar6,(pvVar5->color).r,(pvVar5->color).g,(pvVar5->color).b,
                       (pvVar5->color).a);
      this_local._7_1_ = true;
    }
    else {
      spread = SVGGradientAttributes::spreadMethod((SVGGradientAttributes *)&gradientContentElement)
      ;
      UVar2 = SVGGradientAttributes::gradientUnits((SVGGradientAttributes *)&gradientContentElement)
      ;
      pTVar7 = SVGGradientAttributes::gradientTransform
                         ((SVGGradientAttributes *)&gradientContentElement);
      bbox.w = (pTVar7->m_matrix).a;
      bbox.h = (pTVar7->m_matrix).b;
      if (UVar2 == ObjectBoundingBox) {
        RVar8 = SVGRenderState::fillBoundingBox(state);
        bbox.x = RVar8.w;
        a = bbox.x;
        bbox.y = RVar8.h;
        d = bbox.y;
        local_f4._0_4_ = RVar8.x;
        e = (float)local_f4;
        local_f4._4_4_ = RVar8.y;
        f = local_f4._4_4_;
        local_f4 = RVar8._0_8_;
        bbox._0_8_ = RVar8._8_8_;
        Transform::Transform(&local_10c,a,0.0,0.0,d,e,f);
        Transform::postMultiply((Transform *)&bbox.w,&local_10c);
      }
      pCVar6 = SVGRenderState::operator->(state);
      Canvas::setLinearGradient
                (pCVar6,x1_00,y1_00,x2_00,y2_00,spread,(GradientStops *)local_88,
                 (Transform *)&bbox.w);
      this_local._7_1_ = true;
    }
  }
  lengthContext._12_4_ = 1;
  std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::~vector
            ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_> *)local_88);
  return this_local._7_1_;
}

Assistant:

bool SVGLinearGradientElement::applyPaint(SVGRenderState& state, float opacity) const
{
    auto attributes = collectGradientAttributes();
    auto gradientContentElement = attributes.gradientContentElement();
    auto gradientStops = buildGradientStops(gradientContentElement, opacity);
    if(gradientStops.empty())
        return false;
    LengthContext lengthContext(this, attributes.gradientUnits());
    auto x1 = lengthContext.valueForLength(attributes.x1());
    auto y1 = lengthContext.valueForLength(attributes.y1());
    auto x2 = lengthContext.valueForLength(attributes.x2());
    auto y2 = lengthContext.valueForLength(attributes.y2());
    if(gradientStops.size() == 1 || (x1 == x2 && y1 == y2)) {
        const auto& lastStop = gradientStops.back();
        state->setColor(lastStop.color.r, lastStop.color.g, lastStop.color.b, lastStop.color.a);
        return true;
    }

    auto spreadMethod = attributes.spreadMethod();
    auto gradientUnits = attributes.gradientUnits();
    auto gradientTransform = attributes.gradientTransform();
    if(gradientUnits == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        gradientTransform.postMultiply(Transform(bbox.w, 0, 0, bbox.h, bbox.x, bbox.y));
    }

    state->setLinearGradient(x1, y1, x2, y2, spreadMethod, gradientStops, gradientTransform);
    return true;
}